

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<const_char_*> * __thiscall
asl::Array<const_char_*>::operator=(Array<const_char_*> *this,Array<const_char_*> *b)

{
  char **ppcVar1;
  
  if (this->_a != b->_a) {
    LOCK();
    ppcVar1 = this->_a + -1;
    *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
    UNLOCK();
    if (*(int *)ppcVar1 == 0) {
      free(this,b);
    }
    ppcVar1 = b->_a;
    this->_a = ppcVar1;
    LOCK();
    ppcVar1 = ppcVar1 + -1;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

Array& operator=(const Array& b)
	{
		if (_a == b._a)
			return *this;
		if(--d().rc==0) free();
		_a = b._a;
		++d().rc;
		return *this;
	}